

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_object_list_add(JSContext *ctx,JSObjectList *s,JSObject *obj)

{
  uint32_t uVar1;
  JSObjectListEntry *pJVar2;
  uint32_t *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if ((s->object_size <= s->object_count) &&
     (iVar5 = js_realloc_array(ctx,&s->object_tab,0x10,&s->object_size,s->object_count + 1),
     iVar5 != 0)) {
    return -1;
  }
  uVar6 = s->hash_size;
  if (uVar6 <= s->object_count + 1U) {
    uVar4 = 4;
    if (4 < uVar6) {
      uVar4 = uVar6;
    }
    do {
      uVar6 = uVar4;
      uVar4 = uVar6 * 2;
    } while (uVar6 <= (uint)s->object_count);
    iVar5 = js_object_list_resize_hash(ctx,s,uVar6);
    if (iVar5 != 0) {
      return -1;
    }
  }
  pJVar2 = s->object_tab;
  uVar1 = s->object_count;
  s->object_count = uVar1 + 1;
  uVar6 = (int)obj * 0xc5b & s->hash_size - 1;
  pJVar2[(int)uVar1].obj = obj;
  puVar3 = s->hash_table;
  pJVar2[(int)uVar1].hash_next = puVar3[uVar6];
  puVar3[uVar6] = uVar1;
  return 0;
}

Assistant:

static int js_object_list_add(JSContext *ctx, JSObjectList *s, JSObject *obj)
{
    JSObjectListEntry *e;
    uint32_t h, new_hash_size;
    
    if (js_resize_array(ctx, (void *)&s->object_tab,
                        sizeof(s->object_tab[0]),
                        &s->object_size, s->object_count + 1))
        return -1;
    if (unlikely((s->object_count + 1) >= s->hash_size)) {
        new_hash_size = max_uint32(s->hash_size, 4);
        while (new_hash_size <= s->object_count)
            new_hash_size *= 2;
        if (js_object_list_resize_hash(ctx, s, new_hash_size))
            return -1;
    }
    e = &s->object_tab[s->object_count++];
    h = js_object_list_get_hash(obj, s->hash_size); 
    e->obj = obj;
    e->hash_next = s->hash_table[h];
    s->hash_table[h] = s->object_count - 1;
    return 0;
}